

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  cartesian_cubic<float> *pcVar1;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *pCVar2;
  double *stepSize;
  void *__buf;
  Scalar local_4350;
  CommaInitializer<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_4348;
  vector origin;
  vector extent;
  vector scale;
  Scalar local_42f8;
  DenseStorage<double,__1,__1,_1,_0> local_42f0;
  DenseStorage<double,__1,__1,_1,_0> local_42e0;
  Scalar local_42d0;
  si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3> bucky;
  isosurface mc;
  
  mc.m_shadingSs = 0.0001;
  mc.plyfile.m_currentIndex = 0;
  mc.plyfile.m_mergeTolerance = 1e-12;
  mc.plyfile.verts.super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mc.plyfile.verts.super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  mc.plyfile.verts.super__Vector_base<sisl::vertex3,_std::allocator<sisl::vertex3>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mc.plyfile.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  mc.plyfile.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  mc.plyfile.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mc.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  mc.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  mc.faces.
  super__Vector_base<std::tuple<int,_int,_int>,_std::allocator<std::tuple<int,_int,_int>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  memcpy(mc.edges,&DAT_0011f948,0x200);
  memcpy(mc.triangles,&DAT_0011fb48,0x4000);
  scale.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_ = 0x20
  ;
  origin.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)
       CONCAT44(origin.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                m_data._4_4_,0x20);
  local_4348.m_xpr._0_4_ =
       scale.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data._0_4_;
  std::__cxx11::string::string((string *)&bucky,"data/Bucky.raw",(allocator *)&local_4350);
  extent.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)
       ((ulong)extent.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
               m_data._4_4_ << 0x20);
  local_42f8 = (Scalar)((ulong)local_42f8 & 0xffffffffffffff00);
  pcVar1 = sisl::io::read_raw_file<float>
                     ((int *)&local_4348,(int *)&scale,(int *)&origin,(string *)&bucky,
                      (e_datatype *)&extent,(bool *)&local_42f8);
  std::__cxx11::string::~string((string *)&bucky);
  sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::si_function(&bucky);
  local_4348.m_xpr._0_4_ = 3;
  bucky._lattice = pcVar1;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&scale,(int *)&local_4348);
  origin.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x403f000000000000;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_4348,&scale,(Scalar *)&origin);
  extent.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x403f000000000000;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_4348,(Scalar *)&extent);
  local_4350 = 31.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_4350);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_4348);
  sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::set_scale(&bucky,&scale);
  local_4348.m_xpr._0_4_ = 3;
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&origin,(int *)&local_4348);
  local_4348.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)CONCAT44(local_4348.m_xpr._4_4_,3);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&extent,(int *)&local_4348);
  local_4350 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_4348,&origin,&local_4350);
  local_42f8 = 0.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_4348,&local_42f8);
  local_42d0 = 0.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_42d0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_4348);
  local_4350 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::CommaInitializer
            (&local_4348,&extent,&local_4350);
  local_42f8 = 1.0;
  pCVar2 = Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_
                     (&local_4348,&local_42f8);
  local_42d0 = 1.0;
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::operator_(pCVar2,&local_42d0);
  Eigen::CommaInitializer<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::finished(&local_4348);
  local_4348.m_xpr = (Matrix<double,__1,_1,_0,__1,_1> *)0x405fc00000000000;
  local_4350 = 0.05;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_42e0,(DenseStorage<double,__1,__1,_1,_0> *)&origin);
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::DenseStorage
            (&local_42f0,(DenseStorage<double,__1,__1,_1,_0> *)&extent);
  stepSize = &local_4350;
  sisl::utility::isosurface::march_function
            (&mc,&bucky.super_function,(double *)&local_4348,stepSize,(vector *)&local_42e0,
             (vector *)&local_42f0,true,(function *)0x0,(function *)0x0,(function *)0x0);
  free(local_42f0.m_data);
  free(local_42e0.m_data);
  std::__cxx11::string::string((string *)&local_4348,"bucky.ply",(allocator *)&local_4350);
  sisl::utility::ply_mesh::write(&mc.plyfile,(int)&local_4348,__buf,(size_t)stepSize);
  std::__cxx11::string::~string((string *)&local_4348);
  free(extent.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(origin.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free((void *)CONCAT44(scale.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data._4_4_,
                        scale.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
                        m_storage.m_data._0_4_));
  sisl::si_function<sisl::cartesian_cubic<float>,_sisl::tp_linear,_3>::~si_function(&bucky);
  sisl::utility::isosurface::~isosurface(&mc);
  return 0;
}

Assistant:

int main(int argc, char const *argv[])
{

	sisl::utility::isosurface mc;

    // This reads the data into memory, we specify float here,
    // which means that the lattice will hold floating values
    // but we could choose other, more compact data types
    cartesian_cubic<float> *cc = sisl::io::read_raw_file<float>(
                32, 32, 32, "data/Bucky.raw", SDT_UINT8);

    
    // Next, combine this data with a basis function in a si_function
    si_function<
        cartesian_cubic<float>, // specify the lattice (and its data type)
        tp_linear,              // specify the basis function
        3> bucky(cc);           // specify the dimension, and call this si_function bucky (fed with the cc lattice)
   
    // by default, an si_fuction has no scaling set, it'll exend to the maximum 
    // boundary of the lattice, 32 x 32 x 32 in this case
    vector scale(3);
    // Scaling is in the form f(s*x, s*y, s*z), so we specify 32-1,32-1,32-1 as scale
    scale << 31.,31.,31.;
    bucky.set_scale(scale);


    // Now we can just use the marching cubes algorithm to march over the data
    vector origin(3), extent(3);

    // Setup the volume over which MC will run
    origin << 0,0,0;
    extent << 1,1,1;

    mc.march_function(
            &bucky,
            127.0,
            0.05,
            origin,
            extent,
            true
    );

    // Write the output as a ply file
    mc.write_surface("bucky.ply");
}